

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O3

string * __thiscall
cmCustomCommandGenerator::GetDepfile_abi_cxx11_
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this)

{
  cmLocalGenerator *lg;
  pointer pcVar1;
  string *psVar2;
  cmListFileBacktrace *pcVar3;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmGeneratorExpression ge;
  undefined1 local_88 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long local_50 [2];
  string local_40;
  
  psVar2 = cmCustomCommand::GetDepfile_abi_cxx11_(this->CC);
  if (psVar2->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    pcVar3 = cmCustomCommand::GetBacktrace(this->CC);
    local_88._8_8_ =
         (pcVar3->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_78 = (pcVar3->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_78->_M_use_count = local_78->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_78->_M_use_count = local_78->_M_use_count + 1;
      }
    }
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_70,(cmListFileBacktrace *)(local_88 + 8));
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    }
    lg = this->LG;
    pcVar1 = (psVar2->_M_dataplus)._M_p;
    local_60._M_allocated_capacity = (size_type)local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_70 + 0x10),pcVar1,pcVar1 + psVar2->_M_string_length);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_88,(string *)local_70);
    if ((long *)local_60._M_allocated_capacity != local_50) {
      operator_delete((void *)local_60._M_allocated_capacity,local_50[0] + 1);
    }
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    psVar2 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)local_88._0_8_,lg,&this->OutputConfig,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                        (cmGeneratorTarget *)0x0,&local_40);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (psVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,
                      CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                               local_40.field_2._M_local_buf[0]) + 1);
    }
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_88);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetDepfile() const
{
  const auto& depfile = this->CC->GetDepfile();
  if (depfile.empty()) {
    return "";
  }

  cmGeneratorExpression ge(this->CC->GetBacktrace());
  return EvaluateDepfile(depfile, ge, this->LG, this->OutputConfig);
}